

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_unsupported_encoder(archive *a,la_zstream_conflict *lastrm,char *name)

{
  char *name_local;
  la_zstream_conflict *lastrm_local;
  archive *a_local;
  
  archive_set_error(a,-1,"%s compression not supported on this platform",name);
  lastrm->valid = 0;
  lastrm->real_stream = (void *)0x0;
  return -0x19;
}

Assistant:

static int
compression_unsupported_encoder(struct archive *a,
    struct la_zstream *lastrm, const char *name)
{

	archive_set_error(a, ARCHIVE_ERRNO_MISC,
	    "%s compression not supported on this platform", name);
	lastrm->valid = 0;
	lastrm->real_stream = NULL;
	return (ARCHIVE_FAILED);
}